

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type.cc
# Opt level: O1

Value * __thiscall iqxmlrpc::Struct::operator[](Struct *this,string *f)

{
  const_iterator cVar1;
  No_field *this_00;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Value_*>_>_>
          ::find(&(this->values)._M_t,f);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->values)._M_t._M_impl.super__Rb_tree_header) {
    return *(Value **)(cVar1._M_node + 2);
  }
  this_00 = (No_field *)__cxa_allocate_exception(0x18);
  No_field::No_field(this_00,f);
  __cxa_throw(this_00,&No_field::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Value& Struct::operator []( const std::string& f ) const
{
  const_iterator i = values.find(f);

  if( i == values.end() )
    throw No_field( f );

  return (*i->second);
}